

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

wchar_t rd_ignore(void)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  char *message;
  quark_t qVar4;
  short local_14a;
  char local_148 [6];
  int16_t runeid;
  char tmp_2 [80];
  object_kind *k_1;
  char local_e8 [6];
  uint8_t sval_1;
  uint8_t tval_1;
  char tmp_1 [80];
  object_kind *k;
  char local_88 [6];
  uint8_t sval;
  uint8_t tval;
  char tmp [80];
  bitflag local_2d [4];
  byte local_29;
  ushort local_28;
  undefined1 uStack_26;
  bitflag itypes [4];
  bitflag flags;
  uint16_t inscriptions;
  uint16_t itype_size;
  uint16_t file_e_max;
  uint8_t tmp8u;
  size_t j;
  size_t i;
  
  flags = '\x18';
  rd_byte(&flags);
  if (flags == '\x1b') {
    for (j = 0; j < 0x1b; j = j + 1) {
      rd_byte(ignore_level + j);
    }
  }
  else {
    strip_bytes((uint)flags);
  }
  rd_u16b((uint16_t *)(itypes + 1));
  rd_u16b((uint16_t *)&uStack_26);
  if (_uStack_26 < 5) {
    for (j = 0; j < (ushort)itypes._1_2_; j = j + 1) {
      if (j < z_info->e_max) {
        rd_byte(&local_29);
        e_info[j].everseen = (local_29 & 2) != 0;
        for (_inscriptions = 0; _inscriptions < _uStack_26; _inscriptions = _inscriptions + 1) {
          rd_byte(local_2d + _inscriptions);
        }
        if (_uStack_26 == 4) {
          for (_inscriptions = 0; _inscriptions < 0x1b; _inscriptions = _inscriptions + 1) {
            _Var1 = flag_has_dbg(local_2d,4,(int)_inscriptions,"itypes","j");
            if (_Var1) {
              ego_ignore_toggle((wchar_t)j,(wchar_t)_inscriptions);
            }
          }
        }
      }
    }
    rd_u16b(&local_28);
    for (j = 0; j < local_28; j = j + 1) {
      rd_string(local_88,0x50);
      wVar2 = tval_find_idx(local_88);
      rd_string(local_88,0x50);
      wVar3 = lookup_sval(wVar2 & 0xff,local_88);
      tmp_1._72_8_ = lookup_kind(wVar2 & 0xff,wVar3 & 0xff);
      if ((object_kind *)tmp_1._72_8_ == (object_kind *)0x0) {
        quit_fmt("lookup_kind(%d, %d) failed",(ulong)(byte)wVar2,(ulong)(byte)wVar3);
      }
      rd_string(local_88,0x50);
      qVar4 = quark_add(local_88);
      *(quark_t *)(tmp_1._72_8_ + 0x288) = qVar4;
    }
    rd_u16b(&local_28);
    for (j = 0; j < local_28; j = j + 1) {
      rd_string(local_e8,0x50);
      wVar2 = tval_find_idx(local_e8);
      rd_string(local_e8,0x50);
      wVar3 = lookup_sval(wVar2 & 0xff,local_e8);
      tmp_2._72_8_ = lookup_kind(wVar2 & 0xff,wVar3 & 0xff);
      if ((object_kind *)tmp_2._72_8_ == (object_kind *)0x0) {
        quit_fmt("lookup_kind(%d, %d) failed",(ulong)(byte)wVar2,(ulong)(byte)wVar3);
      }
      rd_string(local_e8,0x50);
      qVar4 = quark_add(local_e8);
      *(quark_t *)(tmp_2._72_8_ + 0x290) = qVar4;
    }
    rd_u16b(&local_28);
    for (j = 0; j < local_28; j = j + 1) {
      rd_s16b(&local_14a);
      rd_string(local_148,0x50);
      rune_set_note((long)local_14a,local_148);
    }
    i._4_4_ = L'\0';
  }
  else {
    message = format("Too many (%u) ignore bytes!",(ulong)_uStack_26);
    note(message);
    i._4_4_ = L'\xffffffff';
  }
  return i._4_4_;
}

Assistant:

int rd_ignore(void)
{
	size_t i, j;
	uint8_t tmp8u = 24;
	uint16_t file_e_max;
	uint16_t itype_size;
	uint16_t inscriptions;

	/* Read how many ignore bytes we have */
	rd_byte(&tmp8u);

	/* Check against current number */
	if (tmp8u != ignore_size) {
		strip_bytes(tmp8u);
	} else {
		for (i = 0; i < ignore_size; i++)
			rd_byte(&ignore_level[i]);
	}

	/* Read the number of saved ego-item */
	rd_u16b(&file_e_max);
	rd_u16b(&itype_size);
	if (itype_size > ITYPE_SIZE) {
		note(format("Too many (%u) ignore bytes!", itype_size));
		return (-1);
	}

	for (i = 0; i < file_e_max; i++) {
		if (i < z_info->e_max) {
			bitflag flags, itypes[ITYPE_SIZE];
			
			/* Read and extract the everseen flag */
			rd_byte(&flags);
			e_info[i].everseen = (flags & 0x02) ? true : false;

			/* Read and extract the ignore flags */
			for (j = 0; j < itype_size; j++)
				rd_byte(&itypes[j]);

			/* If number of ignore types has changed, don't set anything */
			if (itype_size == ITYPE_SIZE) {
				for (j = ITYPE_NONE; j < ITYPE_MAX; j++)
					if (itype_has(itypes, j))
						ego_ignore_toggle(i, j);
			}
		}
	}

	/* Read the current number of aware object auto-inscriptions */
	rd_u16b(&inscriptions);

	/* Read the aware object autoinscriptions array */
	for (i = 0; i < inscriptions; i++) {
		char tmp[80];
		uint8_t tval, sval;
		struct object_kind *k;

		rd_string(tmp, sizeof(tmp));
		tval = tval_find_idx(tmp);
		rd_string(tmp, sizeof(tmp));
		sval = lookup_sval(tval, tmp);
		k = lookup_kind(tval, sval);
		if (!k)
			quit_fmt("lookup_kind(%d, %d) failed", tval, sval);
		rd_string(tmp, sizeof(tmp));
		k->note_aware = quark_add(tmp);
	}

	/* Read the current number of unaware object auto-inscriptions */
	rd_u16b(&inscriptions);

	/* Read the unaware object autoinscriptions array */
	for (i = 0; i < inscriptions; i++) {
		char tmp[80];
		uint8_t tval, sval;
		struct object_kind *k;

		rd_string(tmp, sizeof(tmp));
		tval = tval_find_idx(tmp);
		rd_string(tmp, sizeof(tmp));
		sval = lookup_sval(tval, tmp);
		k = lookup_kind(tval, sval);
		if (!k)
			quit_fmt("lookup_kind(%d, %d) failed", tval, sval);
		rd_string(tmp, sizeof(tmp));
		k->note_unaware = quark_add(tmp);
	}

	/* Read the current number of rune auto-inscriptions */
	rd_u16b(&inscriptions);

	/* Read the rune autoinscriptions array */
	for (i = 0; i < inscriptions; i++) {
		char tmp[80];
		int16_t runeid;

		rd_s16b(&runeid);
		rd_string(tmp, sizeof(tmp));
		rune_set_note(runeid, tmp);
	}

	return 0;
}